

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O1

_Bool openssh_new_write(Filename *filename,ssh2_userkey *ukey,char *passphrase)

{
  BinarySink *bs;
  ptrlen input;
  ssh_key *psVar1;
  strbuf *buf_o;
  strbuf *buf_o_00;
  strbuf *buf_o_01;
  strbuf *psVar2;
  size_t sVar3;
  ssh_cipher *psVar4;
  FILE *__stream;
  uchar val;
  BinarySink *bs_00;
  ulong val_00;
  ptrlen salt;
  ptrlen passphrase_00;
  uint8_t checkint_buf [4];
  uchar bcrypt_salt [16];
  uchar keybuf [48];
  uint local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  uchar local_68 [32];
  undefined1 local_48 [24];
  
  psVar1 = (*ukey->key->vt->base_key)(ukey->key);
  buf_o = strbuf_new();
  (*psVar1->vt->public_blob)(psVar1,buf_o->binarysink_);
  buf_o_00 = strbuf_new_nm();
  (*psVar1->vt->openssh_blob)(psVar1,buf_o_00->binarysink_);
  buf_o_01 = strbuf_new_nm();
  bs = buf_o_01->binarysink_;
  BinarySink_put_asciz(bs,"openssh-key-v1");
  if (passphrase == (char *)0x0) {
    local_78 = 0;
    uStack_70 = 0;
    BinarySink_put_stringz(bs,"none");
    BinarySink_put_stringz(bs,"none");
    BinarySink_put_stringz(bs,"");
  }
  else {
    random_read(&local_78,0x10);
    BinarySink_put_stringz(bs,"aes256-ctr");
    BinarySink_put_stringz(bs,"bcrypt");
    psVar2 = strbuf_new_nm();
    BinarySink_put_string(psVar2->binarysink_,&local_78,0x10);
    BinarySink_put_uint32(psVar2->binarysink_,0x10);
    BinarySink_put_stringsb(bs,psVar2);
  }
  BinarySink_put_uint32(bs,1);
  BinarySink_put_string(bs,buf_o->s,buf_o->len);
  psVar2 = strbuf_new_nm();
  random_read(&local_7c,4);
  val_00 = (ulong)(local_7c >> 0x18 | (local_7c & 0xff0000) >> 8 | (local_7c & 0xff00) << 8 |
                  local_7c << 0x18);
  bs_00 = psVar2->binarysink_;
  BinarySink_put_uint32(bs_00,val_00);
  BinarySink_put_uint32(bs_00,val_00);
  BinarySink_put_stringz(bs_00,psVar1->vt->ssh_id);
  BinarySink_put_data(bs_00,buf_o_00->s,buf_o_00->len);
  BinarySink_put_stringz(bs_00,ukey->comment);
  val = '\x01';
  do {
    BinarySink_put_byte(bs_00,val);
    val = val + '\x01';
  } while ((psVar2->len & 0xf) != 0);
  if (passphrase != (char *)0x0) {
    sVar3 = strlen(passphrase);
    salt.len = 0x10;
    salt.ptr = &local_78;
    passphrase_00.len = sVar3;
    passphrase_00.ptr = passphrase;
    openssh_bcrypt(passphrase_00,salt,0x10,local_68,0x30);
    psVar4 = aes_select(&ssh_aes256_sdctr);
    (*psVar4->vt->setkey)(psVar4,local_68);
    (*psVar4->vt->setiv)(psVar4,local_48);
    (*psVar4->vt->encrypt)(psVar4,psVar2->u,(int)psVar2->len);
    (*psVar4->vt->free)(psVar4);
    smemclr(local_68,0x30);
  }
  BinarySink_put_stringsb(bs,psVar2);
  __stream = (FILE *)f_open(filename,"wb",true);
  if (__stream != (FILE *)0x0) {
    fputs("-----BEGIN OPENSSH PRIVATE KEY-----\n",__stream);
    input.ptr = buf_o_01->u;
    input.len = buf_o_01->len;
    base64_encode_fp((FILE *)__stream,input,0x40);
    fputs("-----END OPENSSH PRIVATE KEY-----\n",__stream);
    fclose(__stream);
  }
  if (buf_o_01 != (strbuf *)0x0) {
    strbuf_free(buf_o_01);
  }
  strbuf_free(buf_o_00);
  strbuf_free(buf_o);
  return __stream != (FILE *)0x0;
}

Assistant:

static bool openssh_new_write(
    const Filename *filename, ssh2_userkey *ukey, const char *passphrase)
{
    strbuf *pubblob, *privblob, *cblob;
    int padvalue;
    unsigned checkint;
    bool ret = false;
    unsigned char bcrypt_salt[16];
    const int bcrypt_rounds = 16;
    FILE *fp;

    /* OpenSSH's private key files never contain a certificate, so
     * revert to the underlying base key if necessary */
    ssh_key *key = ssh_key_base_key(ukey->key);

    /*
     * Fetch the key blobs and find out the lengths of things.
     */
    pubblob = strbuf_new();
    ssh_key_public_blob(key, BinarySink_UPCAST(pubblob));
    privblob = strbuf_new_nm();
    ssh_key_openssh_blob(key, BinarySink_UPCAST(privblob));

    /*
     * Construct the cleartext version of the blob.
     */
    cblob = strbuf_new_nm();

    /* Magic number. */
    put_asciz(cblob, "openssh-key-v1");

    /* Cipher and kdf names, and kdf options. */
    if (!passphrase) {
        memset(bcrypt_salt, 0, sizeof(bcrypt_salt)); /* prevent warnings */
        put_stringz(cblob, "none");
        put_stringz(cblob, "none");
        put_stringz(cblob, "");
    } else {
        strbuf *substr;

        random_read(bcrypt_salt, sizeof(bcrypt_salt));
        put_stringz(cblob, "aes256-ctr");
        put_stringz(cblob, "bcrypt");
        substr = strbuf_new_nm();
        put_string(substr, bcrypt_salt, sizeof(bcrypt_salt));
        put_uint32(substr, bcrypt_rounds);
        put_stringsb(cblob, substr);
    }

    /* Number of keys. */
    put_uint32(cblob, 1);

    /* Public blob. */
    put_string(cblob, pubblob->s, pubblob->len);

    /* Private section. */
    {
        strbuf *cpblob = strbuf_new_nm();

        /* checkint. */
        uint8_t checkint_buf[4];
        random_read(checkint_buf, 4);
        checkint = GET_32BIT_MSB_FIRST(checkint_buf);
        put_uint32(cpblob, checkint);
        put_uint32(cpblob, checkint);

        /* Private key. The main private blob goes inline, with no string
         * wrapper. */
        put_stringz(cpblob, ssh_key_ssh_id(key));
        put_data(cpblob, privblob->s, privblob->len);

        /* Comment. */
        put_stringz(cpblob, ukey->comment);

        /* Pad out the encrypted section. */
        padvalue = 1;
        do {
            put_byte(cpblob, padvalue++);
        } while (cpblob->len & 15);

        if (passphrase) {
            /*
             * Encrypt the private section. We need 48 bytes of key
             * material: 32 bytes AES key + 16 bytes iv.
             */
            unsigned char keybuf[48];
            ssh_cipher *cipher;

            openssh_bcrypt(ptrlen_from_asciz(passphrase),
                           make_ptrlen(bcrypt_salt, sizeof(bcrypt_salt)),
                           bcrypt_rounds, keybuf, sizeof(keybuf));

            cipher = ssh_cipher_new(&ssh_aes256_sdctr);
            ssh_cipher_setkey(cipher, keybuf);
            ssh_cipher_setiv(cipher, keybuf + 32);
            ssh_cipher_encrypt(cipher, cpblob->u, cpblob->len);
            ssh_cipher_free(cipher);

            smemclr(keybuf, sizeof(keybuf));
        }

        put_stringsb(cblob, cpblob);
    }

    /*
     * And save it. We'll use Unix line endings just in case it's
     * subsequently transferred in binary mode.
     */
    fp = f_open(filename, "wb", true);      /* ensure Unix line endings */
    if (!fp)
        goto error;
    fputs("-----BEGIN OPENSSH PRIVATE KEY-----\n", fp);
    base64_encode_fp(fp, ptrlen_from_strbuf(cblob), 64);
    fputs("-----END OPENSSH PRIVATE KEY-----\n", fp);
    fclose(fp);
    ret = true;

    error:
    if (cblob)
        strbuf_free(cblob);
    if (privblob)
        strbuf_free(privblob);
    if (pubblob)
        strbuf_free(pubblob);
    return ret;
}